

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

void __thiscall
el::Configurations::unsafeSet
          (Configurations *this,Level level,ConfigurationType configurationType,string *value)

{
  pointer pcVar1;
  Configuration *pCVar2;
  undefined8 *puVar3;
  Level local_24;
  
  local_24 = level;
  pCVar2 = base::utils::RegistryWithPred<el::Configuration,el::Configuration::Predicate>::
           get<el::Level,el::ConfigurationType>
                     ((RegistryWithPred<el::Configuration,el::Configuration::Predicate> *)this,
                      &local_24,configurationType);
  if (pCVar2 == (Configuration *)0x0) {
    puVar3 = (undefined8 *)operator_new(0x30);
    *puVar3 = &PTR__Configuration_001932f0;
    *(Level *)(puVar3 + 1) = local_24;
    *(ConfigurationType *)((long)puVar3 + 0xc) = configurationType;
    puVar3[2] = puVar3 + 4;
    pcVar1 = (value->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar3 + 2),pcVar1,pcVar1 + value->_M_string_length);
    (*(this->super_RegistryWithPred<el::Configuration,_el::Configuration::Predicate>).
      super_AbstractRegistry<el::Configuration,_std::vector<el::Configuration_*,_std::allocator<el::Configuration_*>_>_>
      .super_ThreadSafe._vptr_ThreadSafe[0x10])(this,puVar3);
  }
  else {
    std::__cxx11::string::_M_assign((string *)&pCVar2->m_value);
  }
  if (local_24 == Global) {
    unsafeSetGlobally(this,configurationType,value,false);
  }
  return;
}

Assistant:

void Configurations::unsafeSet(Level level, ConfigurationType configurationType, const std::string& value) {
  Configuration* conf = RegistryWithPred<Configuration, Configuration::Predicate>::get(level, configurationType);
  if (conf == nullptr) {
    registerNew(new Configuration(level, configurationType, value));
  } else {
    conf->setValue(value);
  }
  if (level == Level::Global) {
    unsafeSetGlobally(configurationType, value, false);
  }
}